

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

MaybeResult<wasm::IRBuilder::HoistedVal> * __thiscall
wasm::IRBuilder::hoistLastValue
          (MaybeResult<wasm::IRBuilder::HoistedVal> *__return_storage_ptr__,IRBuilder *this)

{
  undefined8 *puVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  ScopeCtx *pSVar4;
  Expression *pEVar5;
  LocalSet *pLVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  undefined1 local_b0 [8];
  Result<unsigned_int> scratchIdx;
  Result<unsigned_int> _val;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  undefined8 uStack_48;
  uintptr_t local_40;
  Builder *local_38;
  
  pSVar4 = getScope(this);
  ppEVar2 = (pSVar4->exprStack).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar3 = (pSVar4->exprStack).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar7 = (long)ppEVar3 - (long)ppEVar2 >> 3;
  uVar9 = uVar7 & 0xffffffff;
  uVar10 = (int)uVar7 - 1;
  uVar11 = 0xffffffff;
  if ((int)uVar10 < -1) {
    uVar11 = uVar10;
  }
  do {
    uVar9 = uVar9 - 1;
    uVar8 = (uint)uVar9;
    uVar10 = uVar11;
    if ((int)uVar8 < 0) break;
    uVar10 = uVar8;
  } while ((ppEVar2[uVar8 & 0x7fffffff]->type).id == 0);
  if ((int)uVar10 < 0) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> + 0x20
     ) = '\x01';
  }
  else {
    uVar9 = (ulong)uVar10;
    if (uVar7 - 1 != uVar9) {
      local_40 = (ppEVar2[uVar9]->type).id;
      if (local_40 != 1) {
        addScratchLocal((Result<unsigned_int> *)local_b0,this,(Type)local_40);
        std::__detail::__variant::_Copy_ctor_base<false,_unsigned_int,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)
                   ((long)&scratchIdx.val.super__Variant_base<unsigned_int,_wasm::Err>.
                           super__Move_assign_alias<unsigned_int,_wasm::Err>.
                           super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                           super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                           super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),
                   (_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)local_b0);
        if (_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
            super__Move_assign_alias<unsigned_int,_wasm::Err>.
            super__Copy_assign_alias<unsigned_int,_wasm::Err>.
            super__Move_ctor_alias<unsigned_int,_wasm::Err>.
            super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
            super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._24_1_ == '\x01') {
          _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ = &local_50;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                             super__Move_assign_alias<unsigned_int,_wasm::Err>.
                             super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                             super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                             super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),
                     scratchIdx.val.super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_,
                     _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._0_8_ +
                     scratchIdx.val.super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
                           .
                           super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
                   + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> =
               puVar1;
          if ((undefined1 *)
              _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
              super__Move_assign_alias<unsigned_int,_wasm::Err>.
              super__Copy_assign_alias<unsigned_int,_wasm::Err>.
              super__Move_ctor_alias<unsigned_int,_wasm::Err>.
              super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
              super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ == &local_50) {
            *puVar1 = CONCAT71(uStack_4f,local_50);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
             + 0x18) = uStack_48;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->val).
              super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> =
                 _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                 super__Move_assign_alias<unsigned_int,_wasm::Err>.
                 super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                 super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                 super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                 super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
                              .
                              super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
                              .
                              super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
                              .
                              super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
                              .
                              super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
                              .
                              super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
                      + 0x10) = CONCAT71(uStack_4f,local_50);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
           + 8) = local_58;
          local_50 = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
           + 0x20) = '\x02';
          _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ = &local_50;
          std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)
                            ((long)&scratchIdx.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                    super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                    super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                    super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
        }
        else {
          std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)
                            ((long)&scratchIdx.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                    super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                    super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                    super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
          local_38 = &this->builder;
          pLVar6 = Builder::makeLocalSet(local_38,local_b0._0_4_,ppEVar2[uVar9]);
          ppEVar2[uVar9] = (Expression *)pLVar6;
          pEVar5 = (Expression *)MixedArena::allocSpace(&local_38->wasm->allocator,0x18,8);
          pEVar5->_id = LocalGetId;
          *(undefined4 *)(pEVar5 + 1) = local_b0._0_4_;
          (pEVar5->type).id = local_40;
          push(this,pEVar5);
          *(uint *)&(__return_storage_ptr__->val).
                    super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
               = uVar10;
          *(Expression **)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
           + 8) = pEVar5;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>
           + 0x20) = '\0';
        }
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_b0);
        return __return_storage_ptr__;
      }
      if ((ppEVar3[-1]->type).id != 1) {
        pEVar5 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x10,8);
        pEVar5->_id = UnreachableId;
        (pEVar5->type).id = 1;
        push(this,pEVar5);
      }
    }
    *(uint *)&(__return_storage_ptr__->val).
              super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> =
         uVar10;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> + 8) =
         0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> + 0x20
     ) = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<IRBuilder::HoistedVal> IRBuilder::hoistLastValue() {
  auto& stack = getScope().exprStack;
  int index = stack.size() - 1;
  for (; index >= 0; --index) {
    if (stack[index]->type != Type::none) {
      break;
    }
  }
  if (index < 0) {
    // There is no value-producing or unreachable expression.
    return {};
  }
  if (unsigned(index) == stack.size() - 1) {
    // Value-producing expression already on top of the stack.
    return HoistedVal{Index(index), nullptr};
  }
  auto*& expr = stack[index];
  auto type = expr->type;
  if (type == Type::unreachable) {
    // Make sure the top of the stack also has an unreachable expression.
    if (stack.back()->type != Type::unreachable) {
      push(builder.makeUnreachable());
    }
    return HoistedVal{Index(index), nullptr};
  }
  // Hoist with a scratch local.
  auto scratchIdx = addScratchLocal(type);
  CHECK_ERR(scratchIdx);
  expr = builder.makeLocalSet(*scratchIdx, expr);
  auto* get = builder.makeLocalGet(*scratchIdx, type);
  push(get);
  return HoistedVal{Index(index), get};
}